

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_smpl.c
# Opt level: O0

int ossl_ec_GFp_simple_set_Jprojective_coordinates_GFp
              (EC_GROUP *group,EC_POINT *point,BIGNUM *x,BIGNUM *y,BIGNUM *z,BN_CTX *ctx)

{
  int iVar1;
  int iVar2;
  BIGNUM *in_RCX;
  BIGNUM *in_RDX;
  long in_RSI;
  long *in_RDI;
  BIGNUM *in_R8;
  BN_CTX *in_R9;
  int Z_is_one;
  int ret;
  BN_CTX *new_ctx;
  uint in_stack_ffffffffffffffb8;
  int iVar3;
  BN_CTX *a;
  BN_CTX *local_38;
  
  a = (BN_CTX *)0x0;
  iVar3 = 0;
  local_38 = in_R9;
  if ((in_R9 == (BN_CTX *)0x0) &&
     (a = BN_CTX_new_ex((OSSL_LIB_CTX *)(ulong)in_stack_ffffffffffffffb8), local_38 = a,
     a == (BN_CTX *)0x0)) {
    return 0;
  }
  if (((in_RDX == (BIGNUM *)0x0) ||
      ((iVar1 = BN_nnmod(*(BIGNUM **)(in_RSI + 0x10),in_RDX,(BIGNUM *)in_RDI[8],(BN_CTX *)local_38),
       iVar1 != 0 &&
       ((*(long *)(*in_RDI + 0x118) == 0 ||
        (iVar1 = (**(code **)(*in_RDI + 0x118))
                           (in_RDI,*(undefined8 *)(in_RSI + 0x10),*(undefined8 *)(in_RSI + 0x10),
                            local_38), iVar1 != 0)))))) &&
     ((in_RCX == (BIGNUM *)0x0 ||
      ((iVar1 = BN_nnmod(*(BIGNUM **)(in_RSI + 0x18),in_RCX,(BIGNUM *)in_RDI[8],(BN_CTX *)local_38),
       iVar1 != 0 &&
       ((*(long *)(*in_RDI + 0x118) == 0 ||
        (iVar1 = (**(code **)(*in_RDI + 0x118))
                           (in_RDI,*(undefined8 *)(in_RSI + 0x18),*(undefined8 *)(in_RSI + 0x18),
                            local_38), iVar1 != 0)))))))) {
    if (in_R8 != (BIGNUM *)0x0) {
      iVar1 = BN_nnmod(*(BIGNUM **)(in_RSI + 0x20),in_R8,(BIGNUM *)in_RDI[8],(BN_CTX *)local_38);
      if (iVar1 == 0) goto LAB_00251d57;
      iVar1 = BN_is_one((BIGNUM *)a);
      if (*(long *)(*in_RDI + 0x118) != 0) {
        if ((iVar1 == 0) || (*(long *)(*in_RDI + 0x128) == 0)) {
          iVar2 = (**(code **)(*in_RDI + 0x118))
                            (in_RDI,*(undefined8 *)(in_RSI + 0x20),*(undefined8 *)(in_RSI + 0x20),
                             local_38);
        }
        else {
          iVar2 = (**(code **)(*in_RDI + 0x128))(in_RDI,*(undefined8 *)(in_RSI + 0x20),local_38);
        }
        if (iVar2 == 0) goto LAB_00251d57;
      }
      *(int *)(in_RSI + 0x28) = iVar1;
    }
    iVar3 = 1;
  }
LAB_00251d57:
  BN_CTX_free((BN_CTX *)a);
  return iVar3;
}

Assistant:

int ossl_ec_GFp_simple_set_Jprojective_coordinates_GFp(const EC_GROUP *group,
                                                       EC_POINT *point,
                                                       const BIGNUM *x,
                                                       const BIGNUM *y,
                                                       const BIGNUM *z,
                                                       BN_CTX *ctx)
{
    BN_CTX *new_ctx = NULL;
    int ret = 0;

    if (ctx == NULL) {
        ctx = new_ctx = BN_CTX_new_ex(group->libctx);
        if (ctx == NULL)
            return 0;
    }

    if (x != NULL) {
        if (!BN_nnmod(point->X, x, group->field, ctx))
            goto err;
        if (group->meth->field_encode) {
            if (!group->meth->field_encode(group, point->X, point->X, ctx))
                goto err;
        }
    }

    if (y != NULL) {
        if (!BN_nnmod(point->Y, y, group->field, ctx))
            goto err;
        if (group->meth->field_encode) {
            if (!group->meth->field_encode(group, point->Y, point->Y, ctx))
                goto err;
        }
    }

    if (z != NULL) {
        int Z_is_one;

        if (!BN_nnmod(point->Z, z, group->field, ctx))
            goto err;
        Z_is_one = BN_is_one(point->Z);
        if (group->meth->field_encode) {
            if (Z_is_one && (group->meth->field_set_to_one != 0)) {
                if (!group->meth->field_set_to_one(group, point->Z, ctx))
                    goto err;
            } else {
                if (!group->
                    meth->field_encode(group, point->Z, point->Z, ctx))
                    goto err;
            }
        }
        point->Z_is_one = Z_is_one;
    }

    ret = 1;

 err:
    BN_CTX_free(new_ctx);
    return ret;
}